

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# golombrice.h
# Opt level: O0

uint64_t GolombRiceDecode<SpanReader>(BitStreamReader<SpanReader> *bitreader,uint8_t P)

{
  long lVar1;
  uint64_t uVar2;
  byte in_SIL;
  long in_FS_OFFSET;
  BitStreamReader<SpanReader> *unaff_retaddr;
  int in_stack_0000000c;
  uint64_t r;
  uint64_t q;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0;
  while( true ) {
    uVar2 = BitStreamReader<SpanReader>::Read(unaff_retaddr,in_stack_0000000c);
    if (uVar2 != 1) break;
    local_20 = local_20 + 1;
  }
  uVar2 = BitStreamReader<SpanReader>::Read(unaff_retaddr,in_stack_0000000c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (local_20 << (in_SIL & 0x3f)) + uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t GolombRiceDecode(BitStreamReader<IStream>& bitreader, uint8_t P)
{
    // Read unary-encoded quotient: q 1's followed by one 0.
    uint64_t q = 0;
    while (bitreader.Read(1) == 1) {
        ++q;
    }

    uint64_t r = bitreader.Read(P);

    return (q << P) + r;
}